

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer.cpp
# Opt level: O2

bool ExternalSigner::Enumerate
               (string *command,vector<ExternalSigner,_std::allocator<ExternalSigner>_> *signers,
               string chain)

{
  long lVar1;
  pointer pUVar2;
  pointer pEVar3;
  bool bVar4;
  int iVar5;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar6;
  UniValue *pUVar7;
  runtime_error *prVar8;
  string *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  pointer this;
  pointer pEVar9;
  long in_FS_OFFSET;
  string_view key;
  string_view key_00;
  string_view key_01;
  allocator<char> local_d1;
  string local_d0;
  string name;
  UniValue result;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator+(&name,command," enumerate");
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
  RunCommandParseJSON(&result,&name,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&name);
  if (result.typ == VARR) {
    pvVar6 = UniValue::getValues(&result);
    pUVar2 = (pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (this = (pvVar6->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                super__Vector_impl_data._M_start; this != pUVar2; this = this + 1) {
      key._M_str = "error";
      key._M_len = 5;
      pUVar7 = UniValue::find_value(this,key);
      if (pUVar7->typ != VNULL) {
        if (pUVar7->typ == VSTR) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (&name,(tinyformat *)"\'%s\' error: %s",(char *)command,&pUVar7->val,in_R8);
          std::runtime_error::runtime_error(prVar8,(string *)&name);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        else {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          tinyformat::format<std::__cxx11::string>
                    (&name,(tinyformat *)"\'%s\' error",(char *)command,in_RCX);
          std::runtime_error::runtime_error(prVar8,(string *)&name);
          if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        goto LAB_00581cd3;
      }
      key_00._M_str = "fingerprint";
      key_00._M_len = 0xb;
      pUVar7 = UniValue::find_value(this,key_00);
      if (pUVar7->typ == VNULL) {
        prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
        tinyformat::format<std::__cxx11::string>
                  (&name,(tinyformat *)
                         "\'%s\' received invalid response, missing signer fingerprint",
                   (char *)command,in_RCX);
        std::runtime_error::runtime_error(prVar8,(string *)&name);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_00581cd3;
      }
      in_RCX = UniValue::get_str_abi_cxx11_(pUVar7);
      pEVar3 = (signers->super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>).
               _M_impl.super__Vector_impl_data._M_finish;
      bVar4 = false;
      for (pEVar9 = (signers->super__Vector_base<ExternalSigner,_std::allocator<ExternalSigner>_>).
                    _M_impl.super__Vector_impl_data._M_start; pEVar9 != pEVar3; pEVar9 = pEVar9 + 1)
      {
        iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&pEVar9->m_fingerprint,in_RCX);
        bVar4 = (bool)(bVar4 | iVar5 == 0);
      }
      if (bVar4) break;
      name._M_dataplus._M_p = (pointer)&name.field_2;
      name._M_string_length = 0;
      name.field_2._M_local_buf[0] = '\0';
      key_01._M_str = "model";
      key_01._M_len = 5;
      pUVar7 = UniValue::find_value(this,key_01);
      if (pUVar7->typ == VSTR) {
        bVar4 = std::operator==(&pUVar7->val,"");
        if (!bVar4) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&name,&pUVar7->val);
        }
      }
      in_R8 = &name;
      std::vector<ExternalSigner,std::allocator<ExternalSigner>>::
      emplace_back<std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string&>
                ((vector<ExternalSigner,std::allocator<ExternalSigner>> *)signers,command,in_RDX,
                 in_RCX,in_R8);
      std::__cxx11::string::~string((string *)&name);
    }
    UniValue::~UniValue(&result);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return true;
    }
  }
  else {
    prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
    tinyformat::format<std::__cxx11::string>
              (&name,(tinyformat *)"\'%s\' received invalid response, expected array of signers",
               (char *)command,in_RCX);
    std::runtime_error::runtime_error(prVar8,(string *)&name);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
LAB_00581cd3:
  __stack_chk_fail();
}

Assistant:

bool ExternalSigner::Enumerate(const std::string& command, std::vector<ExternalSigner>& signers, const std::string chain)
{
    // Call <command> enumerate
    const UniValue result = RunCommandParseJSON(command + " enumerate");
    if (!result.isArray()) {
        throw std::runtime_error(strprintf("'%s' received invalid response, expected array of signers", command));
    }
    for (const UniValue& signer : result.getValues()) {
        // Check for error
        const UniValue& error = signer.find_value("error");
        if (!error.isNull()) {
            if (!error.isStr()) {
                throw std::runtime_error(strprintf("'%s' error", command));
            }
            throw std::runtime_error(strprintf("'%s' error: %s", command, error.getValStr()));
        }
        // Check if fingerprint is present
        const UniValue& fingerprint = signer.find_value("fingerprint");
        if (fingerprint.isNull()) {
            throw std::runtime_error(strprintf("'%s' received invalid response, missing signer fingerprint", command));
        }
        const std::string& fingerprintStr{fingerprint.get_str()};
        // Skip duplicate signer
        bool duplicate = false;
        for (const ExternalSigner& signer : signers) {
            if (signer.m_fingerprint.compare(fingerprintStr) == 0) duplicate = true;
        }
        if (duplicate) break;
        std::string name;
        const UniValue& model_field = signer.find_value("model");
        if (model_field.isStr() && model_field.getValStr() != "") {
            name += model_field.getValStr();
        }
        signers.emplace_back(command, chain, fingerprintStr, name);
    }
    return true;
}